

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMakefile.cxx
# Opt level: O1

void __thiscall
cmMakefileCall::cmMakefileCall
          (cmMakefileCall *this,cmMakefile *mf,cmListFileFunction *lff,
          optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          *deferId,cmExecutionStatus *status)

{
  long *plVar1;
  int *piVar2;
  _Alloc_hider _Var3;
  cmMakefile *pcVar4;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  _Storage<cmMakefileProfilingData::RAII,_false> _Var5;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var6;
  string *fileName;
  _Storage<cmMakefileProfilingData::RAII,_false> local_148;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_140;
  _Storage<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
  local_130;
  bool local_110;
  cmListFileContext local_108;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_98;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_88;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_78;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_68;
  void **local_50;
  void *local_40 [2];
  char local_30;
  
  this->Makefile = mf;
  (this->ProfilingDataRAII).super__Optional_base<cmMakefileProfilingData::RAII,_false,_false>.
  _M_payload.super__Optional_payload<cmMakefileProfilingData::RAII,_true,_false,_false>.
  super__Optional_payload_base<cmMakefileProfilingData::RAII>._M_engaged = false;
  fileName = cmStateSnapshot::GetExecutionListFile_abi_cxx11_(&mf->StateSnapshot);
  local_110 = false;
  if ((deferId->
      super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
      )._M_payload.
      super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
      .
      super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ._M_engaged == true) {
    local_130._M_value._M_dataplus._M_p = (_Alloc_hider)((long)&local_130._M_value + 0x10);
    _Var3._M_p = (deferId->
                 super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                 )._M_payload.
                 super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
                 .
                 super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 ._M_payload._M_value._M_dataplus._M_p;
    plVar1 = (long *)((long)&(deferId->
                             super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                             )._M_payload.
                             super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
                             .
                             super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                             ._M_payload + 0x10);
    if ((long *)_Var3._M_p == plVar1) {
      local_130._16_8_ = *plVar1;
      local_130._24_8_ =
           *(undefined8 *)
            ((long)&(deferId->
                    super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                    )._M_payload.
                    super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
                    .
                    super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    ._M_payload + 0x18);
    }
    else {
      local_130._16_8_ = *plVar1;
      local_130._M_value._M_dataplus._M_p = (_Alloc_hider)_Var3._M_p;
    }
    local_130._M_value._M_string_length =
         (deferId->
         super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
         )._M_payload.
         super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
         .
         super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         ._M_payload._M_value._M_string_length;
    *(long **)&(deferId->
               super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
               )._M_payload.
               super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
               .
               super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               ._M_payload = plVar1;
    (deferId->
    super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
    )._M_payload.
    super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
    .
    super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ._M_payload._M_value._M_string_length = 0;
    *(undefined1 *)
     ((long)&(deferId->
             super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
             )._M_payload.
             super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
             .
             super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             ._M_payload + 0x10) = 0;
    local_110 = true;
  }
  cmListFileContext::FromListFileFunction
            (&local_108,lff,fileName,
             (optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)&local_130);
  if (local_110 == true) {
    local_110 = false;
    if (local_130._M_value._M_dataplus._M_p != (_Alloc_hider)((long)&local_130._M_value + 0x10)) {
      operator_delete((void *)local_130._M_value._M_dataplus._M_p,local_130._16_8_ + 1);
    }
  }
  pcVar4 = this->Makefile;
  cmListFileContext::cmListFileContext((cmListFileContext *)&local_98,&local_108);
  cmConstStack<cmListFileContext,_cmListFileBacktrace>::Push
            ((cmConstStack<cmListFileContext,_cmListFileBacktrace> *)&local_148._M_value,
             (cmListFileContext *)&pcVar4->Backtrace);
  p_Var6 = p_Stack_140;
  _Var5 = local_148;
  pcVar4 = this->Makefile;
  local_148 = (_Storage<cmMakefileProfilingData::RAII,_false>)0x0;
  p_Stack_140 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  this_00 = (pcVar4->Backtrace).super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.TopEntry.
            super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
            ._M_refcount._M_pi;
  (pcVar4->Backtrace).super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.TopEntry.
  super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
  ._M_ptr = (element_type *)_Var5;
  (pcVar4->Backtrace).super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.TopEntry.
  super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
  ._M_refcount._M_pi = p_Var6;
  if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
  }
  if (p_Stack_140 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_140);
  }
  if (local_30 == '\x01') {
    local_30 = '\0';
    if (local_50 != local_40) {
      operator_delete(local_50,(long)local_40[0] + 1);
    }
  }
  if (local_78 != &local_68) {
    operator_delete(local_78,local_68._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_98._M_allocated_capacity != &local_88) {
    operator_delete((void *)local_98._M_allocated_capacity,local_88._M_allocated_capacity + 1);
  }
  pcVar4 = this->Makefile;
  piVar2 = &pcVar4->RecursionDepth;
  *piVar2 = *piVar2 + 1;
  local_148 = (_Storage<cmMakefileProfilingData::RAII,_false>)status;
  std::vector<cmExecutionStatus*,std::allocator<cmExecutionStatus*>>::
  emplace_back<cmExecutionStatus*>
            ((vector<cmExecutionStatus*,std::allocator<cmExecutionStatus*>> *)
             &pcVar4->ExecutionStatusStack,(cmExecutionStatus **)&local_148);
  cmake::CreateProfilingEntry<cmListFileFunction_const&,cmListFileContext_const&>
            ((cmake *)&local_148._M_value,
             (cmListFileFunction *)this->Makefile->GlobalGenerator->CMakeInstance,
             (cmListFileContext *)lff);
  std::_Optional_payload_base<cmMakefileProfilingData::RAII>::_M_move_assign
            ((_Optional_payload_base<cmMakefileProfilingData::RAII> *)&this->ProfilingDataRAII,
             (_Optional_payload_base<cmMakefileProfilingData::RAII> *)&local_148._M_value);
  if ((char)p_Stack_140 == '\x01') {
    p_Stack_140 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                  ((ulong)p_Stack_140 & 0xffffffffffffff00);
    cmMakefileProfilingData::RAII::~RAII(&local_148._M_value);
  }
  if (local_108.DeferId.
      super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
      ._M_payload.
      super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
      .
      super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ._M_engaged == true) {
    local_108.DeferId.
    super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
    ._M_payload.
    super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
    .
    super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ._M_engaged = false;
    if (local_108.DeferId.
        super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
        ._M_payload.
        super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
        .
        super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ._M_payload._M_value._M_dataplus._M_p !=
        ((pointer)
        ((long)&local_108.DeferId.
                super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                ._M_payload.
                super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
                .
                super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        + 0x10U))._M_p) {
      operator_delete((void *)local_108.DeferId.
                              super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                              ._M_payload.
                              super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
                              .
                              super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                              ._M_payload._M_value._M_dataplus._M_p,
                      local_108.DeferId.
                      super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                      ._M_payload.
                      super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
                      .
                      super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      ._M_payload._16_8_ + 1);
    }
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_108.FilePath._M_dataplus._M_p != &local_108.FilePath.field_2) {
    operator_delete(local_108.FilePath._M_dataplus._M_p,
                    local_108.FilePath.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_108.Name._M_dataplus._M_p != &local_108.Name.field_2) {
    operator_delete(local_108.Name._M_dataplus._M_p,local_108.Name.field_2._M_allocated_capacity + 1
                   );
  }
  return;
}

Assistant:

cmMakefileCall(cmMakefile* mf, cmListFileFunction const& lff,
                 cm::optional<std::string> deferId, cmExecutionStatus& status)
    : Makefile(mf)
  {
    cmListFileContext const& lfc = cmListFileContext::FromListFileFunction(
      lff, this->Makefile->StateSnapshot.GetExecutionListFile(),
      std::move(deferId));
    this->Makefile->Backtrace = this->Makefile->Backtrace.Push(lfc);
    ++this->Makefile->RecursionDepth;
    this->Makefile->ExecutionStatusStack.push_back(&status);
#if !defined(CMAKE_BOOTSTRAP)
    this->ProfilingDataRAII =
      this->Makefile->GetCMakeInstance()->CreateProfilingEntry(lff, lfc);
#endif
  }